

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::percent(QLocale *this)

{
  QLocaleData *in_RDI;
  
  QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4d0019);
  QLocaleData::percentSign(in_RDI);
  return (QString *)in_RDI;
}

Assistant:

QString QLocale::percent() const
{
    return d->m_data->percentSign();
}